

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void Assimp::OpenGEX::copyVectorArray(size_t numItems,DataArrayList *vaList,aiVector3D *vectorArray)

{
  Value *pVVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (numItems != 0) {
    if (vectorArray == (aiVector3D *)0x0) {
      __assert_fail("nullptr != vec3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                    ,0x2ff,"void Assimp::OpenGEX::fillVector3(aiVector3D *, Value *)");
    }
    pfVar2 = &vectorArray->z;
    do {
      pVVar1 = vaList->m_dataList;
      if (pVVar1 == (Value *)0x0) {
        __assert_fail("nullptr != vals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                      ,0x300,"void Assimp::OpenGEX::fillVector3(aiVector3D *, Value *)");
      }
      fVar3 = ODDLParser::Value::getFloat(pVVar1);
      pVVar1 = pVVar1->m_next;
      fVar4 = ODDLParser::Value::getFloat(pVVar1);
      pVVar1 = pVVar1->m_next;
      if (pVVar1 == (Value *)0x0) {
        fVar5 = 0.0;
      }
      else {
        fVar5 = ODDLParser::Value::getFloat(pVVar1);
      }
      ((aiVector3D *)(pfVar2 + -2))->x = fVar3;
      pfVar2[-1] = fVar4;
      *pfVar2 = fVar5;
      vaList = vaList->m_next;
      pfVar2 = pfVar2 + 3;
      numItems = numItems - 1;
    } while (numItems != 0);
  }
  return;
}

Assistant:

static void copyVectorArray( size_t numItems, DataArrayList *vaList, aiVector3D *vectorArray ) {
    for( size_t i = 0; i < numItems; i++ ) {
        Value *next( vaList->m_dataList );
        fillVector3( &vectorArray[ i ], next );
        vaList = vaList->m_next;
    }
}